

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  seqDef **ppsVar1;
  long *plVar2;
  ulong *iEnd;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  BYTE *pBVar6;
  ZSTD_matchState_t *pZVar7;
  ulong *mEnd;
  BYTE *pBVar8;
  U32 *pUVar9;
  U32 *pUVar10;
  long lVar11;
  seqDef *psVar12;
  ulong uVar13;
  bool bVar14;
  BYTE *op_1;
  size_t sVar15;
  BYTE *pBVar16;
  int *piVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  ulong *puVar21;
  uint uVar22;
  uint uVar23;
  long *plVar24;
  uint uVar25;
  BYTE *ip;
  BYTE *iStart;
  ulong *puVar27;
  ulong uVar28;
  ulong *puVar29;
  long *plVar30;
  ulong uVar31;
  ulong uVar32;
  U32 UVar33;
  BYTE *pBVar34;
  BYTE *unaff_R13;
  U32 UVar35;
  ulong uVar36;
  int iVar37;
  U32 UVar38;
  long *plVar39;
  long *plVar40;
  BYTE *ilimit;
  U32 prefixStartIndex;
  BYTE *iend;
  BYTE *base;
  BYTE *prefixStart;
  U32 dictIndexDelta;
  BYTE *dictBase;
  BYTE *dictEnd;
  U32 *hashTable;
  U32 dictStartIndex;
  BYTE *dictStart;
  U32 *dictHashTable;
  U32 local_fc;
  ulong uVar26;
  
  pBVar6 = (ms->window).base;
  uVar3 = (ms->window).dictLimit;
  iStart = pBVar6 + uVar3;
  pZVar7 = ms->dictMatchState;
  uVar4 = (pZVar7->window).dictLimit;
  mEnd = (ulong *)(pZVar7->window).nextSrc;
  pBVar8 = (pZVar7->window).base;
  pBVar34 = pBVar8 + uVar4;
  uVar25 = ((int)pBVar8 - (int)mEnd) + uVar3;
  uVar26 = (ulong)uVar25;
  iEnd = (ulong *)((long)src + srcSize);
  plVar2 = (long *)((long)src + (srcSize - 8));
  plVar39 = (long *)((ulong)(((int)src - (int)iStart) + (int)mEnd == (int)pBVar34) + (long)src);
  uVar5 = (ms->cParams).minMatch;
  pUVar9 = ms->hashTable;
  local_fc = *rep;
  UVar33 = rep[1];
  pUVar10 = pZVar7->hashTable;
  iVar37 = (int)pBVar6;
  if (uVar5 == 5) {
    if (plVar39 < plVar2) {
      uVar5 = (ms->cParams).targetLength;
      uVar20 = (ulong)(uVar5 + (uVar5 == 0));
      bVar18 = 0x40 - (char)(ms->cParams).hashLog;
      uVar5 = (pZVar7->cParams).hashLog;
      ppsVar1 = &seqStore->sequences;
      do {
        lVar11 = *plVar39;
        uVar28 = (ulong)(lVar11 * -0x30e4432345000000) >> (bVar18 & 0x3f);
        uVar36 = (long)plVar39 - (long)pBVar6;
        UVar35 = (U32)uVar36;
        uVar22 = (UVar35 - local_fc) + 1;
        piVar17 = (int *)(pBVar6 + uVar22);
        if (uVar22 < uVar3) {
          piVar17 = (int *)(pBVar8 + (uVar22 - uVar25));
        }
        uVar19 = pUVar9[uVar28];
        pUVar9[uVar28] = UVar35;
        if ((uVar22 - uVar3 < 0xfffffffd) && (*piVar17 == *(int *)((long)plVar39 + 1))) {
          plVar40 = (long *)((long)plVar39 + 1);
          puVar21 = iEnd;
          if (uVar22 < uVar3) {
            puVar21 = mEnd;
          }
          sVar15 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar39 + 5),(BYTE *)(piVar17 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar21,iStart);
          uVar28 = (long)plVar40 - (long)src;
          plVar24 = (long *)seqStore->lit;
          plVar39 = (long *)((long)plVar24 + uVar28);
          do {
            *plVar24 = *src;
            plVar24 = plVar24 + 1;
            src = (void *)((long)src + 8);
          } while (plVar24 < plVar39);
          seqStore->lit = seqStore->lit + uVar28;
          if (0xffff < uVar28) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_R13 = (BYTE *)(sVar15 + 4);
          pBVar16 = (BYTE *)(sVar15 + 1);
          psVar12 = *ppsVar1;
          psVar12->litLength = (U16)uVar28;
          psVar12->offset = 1;
          UVar38 = local_fc;
joined_r0x004e3a24:
          local_fc = UVar38;
          if ((BYTE *)0xffff < pBVar16) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar12->matchLength = (U16)pBVar16;
          *ppsVar1 = psVar12 + 1;
LAB_004e3aec:
          src = (void *)((long)plVar40 + (long)unaff_R13);
          plVar39 = (long *)src;
          if (src <= plVar2) {
            pUVar9[(ulong)(*(long *)(pBVar6 + (uVar36 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                   (bVar18 & 0x3f)] = UVar35 + 2;
            pUVar9[(ulong)(*(long *)((long)src + -2) * -0x30e4432345000000) >> (bVar18 & 0x3f)] =
                 ((int)src + -2) - iVar37;
            do {
              plVar39 = (long *)src;
              if (plVar2 < src) break;
              UVar35 = (int)src - iVar37;
              uVar22 = UVar35 - UVar33;
              pBVar16 = pBVar6;
              if (uVar22 < uVar3) {
                pBVar16 = pBVar8 + -uVar26;
              }
              if ((uVar22 - uVar3 < 0xfffffffd) && (*(int *)(pBVar16 + uVar22) == (int)*src)) {
                puVar21 = iEnd;
                if (uVar22 < uVar3) {
                  puVar21 = mEnd;
                }
                sVar15 = ZSTD_count_2segments
                                   ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar16 + uVar22) + 4),
                                    (BYTE *)iEnd,(BYTE *)puVar21,iStart);
                *(long *)seqStore->lit = *src;
                psVar12 = seqStore->sequences;
                psVar12->litLength = 0;
                psVar12->offset = 1;
                if (0xffff < sVar15 + 1) {
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar12->matchLength = (U16)(sVar15 + 1);
                seqStore->sequences = psVar12 + 1;
                pUVar9[(ulong)(*src * -0x30e4432345000000) >> (bVar18 & 0x3f)] = UVar35;
                src = (void *)((long)src + sVar15 + 4);
                bVar14 = true;
                UVar35 = local_fc;
                local_fc = UVar33;
              }
              else {
                bVar14 = false;
                UVar35 = UVar33;
              }
              UVar33 = UVar35;
              plVar39 = (long *)src;
            } while (bVar14);
          }
        }
        else {
          plVar40 = plVar39;
          if (uVar3 < uVar19) {
            piVar17 = (int *)(pBVar6 + uVar19);
            if (*piVar17 == (int)*plVar39) {
              puVar21 = (ulong *)((long)plVar39 + 4);
              puVar29 = (ulong *)(piVar17 + 1);
              puVar27 = puVar21;
              if (puVar21 < (ulong *)((long)iEnd - 7U)) {
                uVar31 = *puVar21 ^ *puVar29;
                uVar28 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                pBVar16 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
                if (*puVar29 == *puVar21) {
                  puVar27 = (ulong *)((long)plVar39 + 0xc);
                  puVar29 = (ulong *)(piVar17 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar27) goto LAB_004e3917;
                    uVar28 = *puVar29;
                    uVar31 = *puVar27;
                    uVar32 = uVar31 ^ uVar28;
                    uVar13 = 0;
                    if (uVar32 != 0) {
                      for (; (uVar32 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                      }
                    }
                    pBVar16 = (BYTE *)((long)puVar27 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar21))
                    ;
                    puVar27 = puVar27 + 1;
                    puVar29 = puVar29 + 1;
                  } while (uVar28 == uVar31);
                }
              }
              else {
LAB_004e3917:
                if ((puVar27 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar29 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar29 = (ulong *)((long)puVar29 + 4);
                }
                if ((puVar27 < (ulong *)((long)iEnd + -1)) && ((short)*puVar29 == (short)*puVar27))
                {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar29 = (ulong *)((long)puVar29 + 2);
                }
                if (puVar27 < iEnd) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar27));
                }
                pBVar16 = (BYTE *)((long)puVar27 - (long)puVar21);
              }
              unaff_R13 = pBVar16 + 4;
              if ((uVar3 < uVar19) && (src < plVar39)) {
                pBVar16 = pBVar6 + ((ulong)uVar19 - 1);
                do {
                  plVar24 = (long *)((long)plVar40 + -1);
                  if ((*(BYTE *)plVar24 != *pBVar16) ||
                     (unaff_R13 = unaff_R13 + 1, plVar40 = plVar24, pBVar16 <= iStart)) break;
                  pBVar16 = pBVar16 + -1;
                } while (src < plVar24);
              }
              UVar38 = (int)plVar39 - (int)piVar17;
              uVar28 = (long)plVar40 - (long)src;
              plVar24 = (long *)seqStore->lit;
              plVar39 = (long *)((long)plVar24 + uVar28);
              do {
                *plVar24 = *src;
                plVar24 = plVar24 + 1;
                src = (void *)((long)src + 8);
              } while (plVar24 < plVar39);
              seqStore->lit = seqStore->lit + uVar28;
              if (0xffff < uVar28) {
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              pBVar16 = unaff_R13 + -3;
              psVar12 = *ppsVar1;
              psVar12->litLength = (U16)uVar28;
              psVar12->offset = UVar38 + 3;
              UVar33 = local_fc;
              goto joined_r0x004e3a24;
            }
            plVar39 = (long *)((long)plVar39 + ((long)plVar39 - (long)src >> 8) + uVar20);
          }
          else {
            uVar22 = pUVar10[(ulong)(lVar11 * -0x30e4432345000000) >> (0x40U - (char)uVar5 & 0x3f)];
            if ((uVar4 < uVar22) && (*(int *)(pBVar8 + uVar22) == (int)*plVar39)) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar39 + 4),(BYTE *)((long)(pBVar8 + uVar22) + 4),
                                  (BYTE *)iEnd,(BYTE *)mEnd,iStart);
              unaff_R13 = (BYTE *)(sVar15 + 4);
              if ((uVar4 < uVar22) && (src < plVar39)) {
                pBVar16 = pBVar8 + ((ulong)uVar22 - 1);
                do {
                  plVar24 = (long *)((long)plVar39 + -1);
                  plVar40 = plVar39;
                  if ((*(BYTE *)plVar24 != *pBVar16) ||
                     (unaff_R13 = unaff_R13 + 1, plVar40 = plVar24, pBVar16 <= pBVar34)) break;
                  pBVar16 = pBVar16 + -1;
                  plVar39 = plVar24;
                } while (src < plVar24);
              }
              UVar38 = UVar35 - (uVar25 + uVar22);
              uVar28 = (long)plVar40 - (long)src;
              plVar24 = (long *)seqStore->lit;
              plVar39 = (long *)((long)plVar24 + uVar28);
              plVar30 = (long *)src;
              do {
                *plVar24 = *plVar30;
                plVar24 = plVar24 + 1;
                plVar30 = plVar30 + 1;
              } while (plVar24 < plVar39);
              seqStore->lit = seqStore->lit + uVar28;
              if (0xffff < uVar28) {
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              psVar12 = seqStore->sequences;
              psVar12->litLength = (U16)uVar28;
              psVar12->offset = UVar38 + 3;
              if ((BYTE *)0xffff < unaff_R13 + -3) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar12->matchLength = (U16)(unaff_R13 + -3);
              seqStore->sequences = psVar12 + 1;
              bVar14 = true;
              UVar33 = local_fc;
              local_fc = UVar38;
            }
            else {
              plVar40 = (long *)((long)plVar39 + ((long)plVar39 - (long)src >> 8) + uVar20);
              bVar14 = false;
            }
            plVar39 = plVar40;
            if (bVar14) goto LAB_004e3aec;
          }
        }
      } while (plVar39 < plVar2);
    }
  }
  else if (uVar5 == 6) {
    if (plVar39 < plVar2) {
      uVar5 = (ms->cParams).targetLength;
      uVar20 = (ulong)(uVar5 + (uVar5 == 0));
      bVar18 = 0x40 - (char)(ms->cParams).hashLog;
      uVar5 = (pZVar7->cParams).hashLog;
      ppsVar1 = &seqStore->sequences;
      do {
        lVar11 = *plVar39;
        uVar28 = (ulong)(lVar11 * -0x30e4432340650000) >> (bVar18 & 0x3f);
        uVar36 = (long)plVar39 - (long)pBVar6;
        UVar35 = (U32)uVar36;
        uVar22 = (UVar35 - local_fc) + 1;
        piVar17 = (int *)(pBVar6 + uVar22);
        if (uVar22 < uVar3) {
          piVar17 = (int *)(pBVar8 + (uVar22 - uVar25));
        }
        uVar19 = pUVar9[uVar28];
        pUVar9[uVar28] = UVar35;
        if ((uVar22 - uVar3 < 0xfffffffd) && (*piVar17 == *(int *)((long)plVar39 + 1))) {
          plVar40 = (long *)((long)plVar39 + 1);
          puVar21 = iEnd;
          if (uVar22 < uVar3) {
            puVar21 = mEnd;
          }
          sVar15 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar39 + 5),(BYTE *)(piVar17 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar21,iStart);
          uVar28 = (long)plVar40 - (long)src;
          plVar24 = (long *)seqStore->lit;
          plVar39 = (long *)((long)plVar24 + uVar28);
          do {
            *plVar24 = *src;
            plVar24 = plVar24 + 1;
            src = (void *)((long)src + 8);
          } while (plVar24 < plVar39);
          seqStore->lit = seqStore->lit + uVar28;
          if (0xffff < uVar28) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_R13 = (BYTE *)(sVar15 + 4);
          pBVar16 = (BYTE *)(sVar15 + 1);
          psVar12 = *ppsVar1;
          psVar12->litLength = (U16)uVar28;
          psVar12->offset = 1;
          UVar38 = local_fc;
joined_r0x004e3364:
          local_fc = UVar38;
          if ((BYTE *)0xffff < pBVar16) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar12->matchLength = (U16)pBVar16;
          *ppsVar1 = psVar12 + 1;
LAB_004e342a:
          src = (void *)((long)plVar40 + (long)unaff_R13);
          plVar39 = (long *)src;
          if (src <= plVar2) {
            pUVar9[(ulong)(*(long *)(pBVar6 + (uVar36 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                   (bVar18 & 0x3f)] = UVar35 + 2;
            pUVar9[(ulong)(*(long *)((long)src + -2) * -0x30e4432340650000) >> (bVar18 & 0x3f)] =
                 ((int)src + -2) - iVar37;
            do {
              plVar39 = (long *)src;
              if (plVar2 < src) break;
              UVar35 = (int)src - iVar37;
              uVar22 = UVar35 - UVar33;
              pBVar16 = pBVar6;
              if (uVar22 < uVar3) {
                pBVar16 = pBVar8 + -uVar26;
              }
              if ((uVar22 - uVar3 < 0xfffffffd) && (*(int *)(pBVar16 + uVar22) == (int)*src)) {
                puVar21 = iEnd;
                if (uVar22 < uVar3) {
                  puVar21 = mEnd;
                }
                sVar15 = ZSTD_count_2segments
                                   ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar16 + uVar22) + 4),
                                    (BYTE *)iEnd,(BYTE *)puVar21,iStart);
                *(long *)seqStore->lit = *src;
                psVar12 = seqStore->sequences;
                psVar12->litLength = 0;
                psVar12->offset = 1;
                if (0xffff < sVar15 + 1) {
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar12->matchLength = (U16)(sVar15 + 1);
                seqStore->sequences = psVar12 + 1;
                pUVar9[(ulong)(*src * -0x30e4432340650000) >> (bVar18 & 0x3f)] = UVar35;
                src = (void *)((long)src + sVar15 + 4);
                bVar14 = true;
                UVar35 = local_fc;
                local_fc = UVar33;
              }
              else {
                bVar14 = false;
                UVar35 = UVar33;
              }
              UVar33 = UVar35;
              plVar39 = (long *)src;
            } while (bVar14);
          }
        }
        else {
          plVar40 = plVar39;
          if (uVar3 < uVar19) {
            piVar17 = (int *)(pBVar6 + uVar19);
            if (*piVar17 == (int)*plVar39) {
              puVar21 = (ulong *)((long)plVar39 + 4);
              puVar29 = (ulong *)(piVar17 + 1);
              puVar27 = puVar21;
              if (puVar21 < (ulong *)((long)iEnd - 7U)) {
                uVar31 = *puVar21 ^ *puVar29;
                uVar28 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                pBVar16 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
                if (*puVar29 == *puVar21) {
                  puVar27 = (ulong *)((long)plVar39 + 0xc);
                  puVar29 = (ulong *)(piVar17 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar27) goto LAB_004e3257;
                    uVar28 = *puVar29;
                    uVar31 = *puVar27;
                    uVar32 = uVar31 ^ uVar28;
                    uVar13 = 0;
                    if (uVar32 != 0) {
                      for (; (uVar32 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                      }
                    }
                    pBVar16 = (BYTE *)((long)puVar27 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar21))
                    ;
                    puVar27 = puVar27 + 1;
                    puVar29 = puVar29 + 1;
                  } while (uVar28 == uVar31);
                }
              }
              else {
LAB_004e3257:
                if ((puVar27 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar29 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar29 = (ulong *)((long)puVar29 + 4);
                }
                if ((puVar27 < (ulong *)((long)iEnd + -1)) && ((short)*puVar29 == (short)*puVar27))
                {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar29 = (ulong *)((long)puVar29 + 2);
                }
                if (puVar27 < iEnd) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar27));
                }
                pBVar16 = (BYTE *)((long)puVar27 - (long)puVar21);
              }
              unaff_R13 = pBVar16 + 4;
              if ((uVar3 < uVar19) && (src < plVar39)) {
                pBVar16 = pBVar6 + ((ulong)uVar19 - 1);
                do {
                  plVar24 = (long *)((long)plVar40 + -1);
                  if ((*(BYTE *)plVar24 != *pBVar16) ||
                     (unaff_R13 = unaff_R13 + 1, plVar40 = plVar24, pBVar16 <= iStart)) break;
                  pBVar16 = pBVar16 + -1;
                } while (src < plVar24);
              }
              UVar38 = (int)plVar39 - (int)piVar17;
              uVar28 = (long)plVar40 - (long)src;
              plVar24 = (long *)seqStore->lit;
              plVar39 = (long *)((long)plVar24 + uVar28);
              do {
                *plVar24 = *src;
                plVar24 = plVar24 + 1;
                src = (void *)((long)src + 8);
              } while (plVar24 < plVar39);
              seqStore->lit = seqStore->lit + uVar28;
              if (0xffff < uVar28) {
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              pBVar16 = unaff_R13 + -3;
              psVar12 = *ppsVar1;
              psVar12->litLength = (U16)uVar28;
              psVar12->offset = UVar38 + 3;
              UVar33 = local_fc;
              goto joined_r0x004e3364;
            }
            plVar39 = (long *)((long)plVar39 + ((long)plVar39 - (long)src >> 8) + uVar20);
          }
          else {
            uVar22 = pUVar10[(ulong)(lVar11 * -0x30e4432340650000) >> (0x40U - (char)uVar5 & 0x3f)];
            if ((uVar4 < uVar22) && (*(int *)(pBVar8 + uVar22) == (int)*plVar39)) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar39 + 4),(BYTE *)((long)(pBVar8 + uVar22) + 4),
                                  (BYTE *)iEnd,(BYTE *)mEnd,iStart);
              unaff_R13 = (BYTE *)(sVar15 + 4);
              if ((uVar4 < uVar22) && (src < plVar39)) {
                pBVar16 = pBVar8 + ((ulong)uVar22 - 1);
                do {
                  plVar24 = (long *)((long)plVar39 + -1);
                  plVar40 = plVar39;
                  if ((*(BYTE *)plVar24 != *pBVar16) ||
                     (unaff_R13 = unaff_R13 + 1, plVar40 = plVar24, pBVar16 <= pBVar34)) break;
                  pBVar16 = pBVar16 + -1;
                  plVar39 = plVar24;
                } while (src < plVar24);
              }
              UVar38 = UVar35 - (uVar25 + uVar22);
              uVar28 = (long)plVar40 - (long)src;
              plVar24 = (long *)seqStore->lit;
              plVar39 = (long *)((long)plVar24 + uVar28);
              plVar30 = (long *)src;
              do {
                *plVar24 = *plVar30;
                plVar24 = plVar24 + 1;
                plVar30 = plVar30 + 1;
              } while (plVar24 < plVar39);
              seqStore->lit = seqStore->lit + uVar28;
              if (0xffff < uVar28) {
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              psVar12 = seqStore->sequences;
              psVar12->litLength = (U16)uVar28;
              psVar12->offset = UVar38 + 3;
              if ((BYTE *)0xffff < unaff_R13 + -3) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar12->matchLength = (U16)(unaff_R13 + -3);
              seqStore->sequences = psVar12 + 1;
              bVar14 = true;
              UVar33 = local_fc;
              local_fc = UVar38;
            }
            else {
              plVar40 = (long *)((long)plVar39 + ((long)plVar39 - (long)src >> 8) + uVar20);
              bVar14 = false;
            }
            plVar39 = plVar40;
            if (bVar14) goto LAB_004e342a;
          }
        }
      } while (plVar39 < plVar2);
    }
  }
  else if (uVar5 == 7) {
    if (plVar39 < plVar2) {
      uVar5 = (ms->cParams).targetLength;
      uVar20 = (ulong)(uVar5 + (uVar5 == 0));
      bVar18 = 0x40 - (char)(ms->cParams).hashLog;
      uVar5 = (pZVar7->cParams).hashLog;
      ppsVar1 = &seqStore->sequences;
      do {
        lVar11 = *plVar39;
        uVar28 = (ulong)(lVar11 * -0x30e44323405a9d00) >> (bVar18 & 0x3f);
        uVar36 = (long)plVar39 - (long)pBVar6;
        UVar35 = (U32)uVar36;
        uVar22 = (UVar35 - local_fc) + 1;
        piVar17 = (int *)(pBVar6 + uVar22);
        if (uVar22 < uVar3) {
          piVar17 = (int *)(pBVar8 + (uVar22 - uVar25));
        }
        uVar19 = pUVar9[uVar28];
        pUVar9[uVar28] = UVar35;
        if ((uVar22 - uVar3 < 0xfffffffd) && (*piVar17 == *(int *)((long)plVar39 + 1))) {
          plVar40 = (long *)((long)plVar39 + 1);
          puVar21 = iEnd;
          if (uVar22 < uVar3) {
            puVar21 = mEnd;
          }
          sVar15 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar39 + 5),(BYTE *)(piVar17 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar21,iStart);
          uVar28 = (long)plVar40 - (long)src;
          plVar24 = (long *)seqStore->lit;
          plVar39 = (long *)((long)plVar24 + uVar28);
          do {
            *plVar24 = *src;
            plVar24 = plVar24 + 1;
            src = (void *)((long)src + 8);
          } while (plVar24 < plVar39);
          seqStore->lit = seqStore->lit + uVar28;
          if (0xffff < uVar28) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_R13 = (BYTE *)(sVar15 + 4);
          pBVar16 = (BYTE *)(sVar15 + 1);
          psVar12 = *ppsVar1;
          psVar12->litLength = (U16)uVar28;
          psVar12->offset = 1;
          UVar38 = local_fc;
joined_r0x004e2c9b:
          local_fc = UVar38;
          if ((BYTE *)0xffff < pBVar16) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar12->matchLength = (U16)pBVar16;
          *ppsVar1 = psVar12 + 1;
LAB_004e2d61:
          src = (void *)((long)plVar40 + (long)unaff_R13);
          plVar39 = (long *)src;
          if (src <= plVar2) {
            pUVar9[(ulong)(*(long *)(pBVar6 + (uVar36 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                   (bVar18 & 0x3f)] = UVar35 + 2;
            pUVar9[(ulong)(*(long *)((long)src + -2) * -0x30e44323405a9d00) >> (bVar18 & 0x3f)] =
                 ((int)src + -2) - iVar37;
            do {
              plVar39 = (long *)src;
              if (plVar2 < src) break;
              UVar35 = (int)src - iVar37;
              uVar22 = UVar35 - UVar33;
              pBVar16 = pBVar6;
              if (uVar22 < uVar3) {
                pBVar16 = pBVar8 + -uVar26;
              }
              if ((uVar22 - uVar3 < 0xfffffffd) && (*(int *)(pBVar16 + uVar22) == (int)*src)) {
                puVar21 = iEnd;
                if (uVar22 < uVar3) {
                  puVar21 = mEnd;
                }
                sVar15 = ZSTD_count_2segments
                                   ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar16 + uVar22) + 4),
                                    (BYTE *)iEnd,(BYTE *)puVar21,iStart);
                *(long *)seqStore->lit = *src;
                psVar12 = seqStore->sequences;
                psVar12->litLength = 0;
                psVar12->offset = 1;
                if (0xffff < sVar15 + 1) {
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar12->matchLength = (U16)(sVar15 + 1);
                seqStore->sequences = psVar12 + 1;
                pUVar9[(ulong)(*src * -0x30e44323405a9d00) >> (bVar18 & 0x3f)] = UVar35;
                src = (void *)((long)src + sVar15 + 4);
                bVar14 = true;
                UVar35 = local_fc;
                local_fc = UVar33;
              }
              else {
                bVar14 = false;
                UVar35 = UVar33;
              }
              UVar33 = UVar35;
              plVar39 = (long *)src;
            } while (bVar14);
          }
        }
        else {
          plVar40 = plVar39;
          if (uVar3 < uVar19) {
            piVar17 = (int *)(pBVar6 + uVar19);
            if (*piVar17 == (int)*plVar39) {
              puVar21 = (ulong *)((long)plVar39 + 4);
              puVar29 = (ulong *)(piVar17 + 1);
              puVar27 = puVar21;
              if (puVar21 < (ulong *)((long)iEnd - 7U)) {
                uVar31 = *puVar21 ^ *puVar29;
                uVar28 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                pBVar16 = (BYTE *)(uVar28 >> 3 & 0x1fffffff);
                if (*puVar29 == *puVar21) {
                  puVar27 = (ulong *)((long)plVar39 + 0xc);
                  puVar29 = (ulong *)(piVar17 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar27) goto LAB_004e2b8e;
                    uVar28 = *puVar29;
                    uVar31 = *puVar27;
                    uVar32 = uVar31 ^ uVar28;
                    uVar13 = 0;
                    if (uVar32 != 0) {
                      for (; (uVar32 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                      }
                    }
                    pBVar16 = (BYTE *)((long)puVar27 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar21))
                    ;
                    puVar27 = puVar27 + 1;
                    puVar29 = puVar29 + 1;
                  } while (uVar28 == uVar31);
                }
              }
              else {
LAB_004e2b8e:
                if ((puVar27 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar29 == (int)*puVar27)) {
                  puVar27 = (ulong *)((long)puVar27 + 4);
                  puVar29 = (ulong *)((long)puVar29 + 4);
                }
                if ((puVar27 < (ulong *)((long)iEnd + -1)) && ((short)*puVar29 == (short)*puVar27))
                {
                  puVar27 = (ulong *)((long)puVar27 + 2);
                  puVar29 = (ulong *)((long)puVar29 + 2);
                }
                if (puVar27 < iEnd) {
                  puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar27));
                }
                pBVar16 = (BYTE *)((long)puVar27 - (long)puVar21);
              }
              unaff_R13 = pBVar16 + 4;
              if ((uVar3 < uVar19) && (src < plVar39)) {
                pBVar16 = pBVar6 + ((ulong)uVar19 - 1);
                do {
                  plVar24 = (long *)((long)plVar40 + -1);
                  if ((*(BYTE *)plVar24 != *pBVar16) ||
                     (unaff_R13 = unaff_R13 + 1, plVar40 = plVar24, pBVar16 <= iStart)) break;
                  pBVar16 = pBVar16 + -1;
                } while (src < plVar24);
              }
              UVar38 = (int)plVar39 - (int)piVar17;
              uVar28 = (long)plVar40 - (long)src;
              plVar24 = (long *)seqStore->lit;
              plVar39 = (long *)((long)plVar24 + uVar28);
              do {
                *plVar24 = *src;
                plVar24 = plVar24 + 1;
                src = (void *)((long)src + 8);
              } while (plVar24 < plVar39);
              seqStore->lit = seqStore->lit + uVar28;
              if (0xffff < uVar28) {
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              pBVar16 = unaff_R13 + -3;
              psVar12 = *ppsVar1;
              psVar12->litLength = (U16)uVar28;
              psVar12->offset = UVar38 + 3;
              UVar33 = local_fc;
              goto joined_r0x004e2c9b;
            }
            plVar39 = (long *)((long)plVar39 + ((long)plVar39 - (long)src >> 8) + uVar20);
          }
          else {
            uVar22 = pUVar10[(ulong)(lVar11 * -0x30e44323405a9d00) >> (0x40U - (char)uVar5 & 0x3f)];
            if ((uVar4 < uVar22) && (*(int *)(pBVar8 + uVar22) == (int)*plVar39)) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar39 + 4),(BYTE *)((long)(pBVar8 + uVar22) + 4),
                                  (BYTE *)iEnd,(BYTE *)mEnd,iStart);
              unaff_R13 = (BYTE *)(sVar15 + 4);
              if ((uVar4 < uVar22) && (src < plVar39)) {
                pBVar16 = pBVar8 + ((ulong)uVar22 - 1);
                do {
                  plVar24 = (long *)((long)plVar39 + -1);
                  plVar40 = plVar39;
                  if ((*(BYTE *)plVar24 != *pBVar16) ||
                     (unaff_R13 = unaff_R13 + 1, plVar40 = plVar24, pBVar16 <= pBVar34)) break;
                  pBVar16 = pBVar16 + -1;
                  plVar39 = plVar24;
                } while (src < plVar24);
              }
              UVar38 = UVar35 - (uVar25 + uVar22);
              uVar28 = (long)plVar40 - (long)src;
              plVar24 = (long *)seqStore->lit;
              plVar39 = (long *)((long)plVar24 + uVar28);
              plVar30 = (long *)src;
              do {
                *plVar24 = *plVar30;
                plVar24 = plVar24 + 1;
                plVar30 = plVar30 + 1;
              } while (plVar24 < plVar39);
              seqStore->lit = seqStore->lit + uVar28;
              if (0xffff < uVar28) {
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              psVar12 = seqStore->sequences;
              psVar12->litLength = (U16)uVar28;
              psVar12->offset = UVar38 + 3;
              if ((BYTE *)0xffff < unaff_R13 + -3) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar12->matchLength = (U16)(unaff_R13 + -3);
              seqStore->sequences = psVar12 + 1;
              bVar14 = true;
              UVar33 = local_fc;
              local_fc = UVar38;
            }
            else {
              plVar40 = (long *)((long)plVar39 + ((long)plVar39 - (long)src >> 8) + uVar20);
              bVar14 = false;
            }
            plVar39 = plVar40;
            if (bVar14) goto LAB_004e2d61;
          }
        }
      } while (plVar39 < plVar2);
    }
  }
  else if (plVar39 < plVar2) {
    uVar5 = (ms->cParams).targetLength;
    uVar20 = (ulong)(uVar5 + (uVar5 == 0));
    bVar18 = 0x20 - (char)(ms->cParams).hashLog;
    uVar5 = (pZVar7->cParams).hashLog;
    ppsVar1 = &seqStore->sequences;
    do {
      uVar23 = (uint)((int)*plVar39 * -0x61c8864f) >> (bVar18 & 0x1f);
      uVar28 = (long)plVar39 - (long)pBVar6;
      uVar22 = pUVar9[uVar23];
      UVar35 = (U32)uVar28;
      uVar19 = (UVar35 - local_fc) + 1;
      piVar17 = (int *)(pBVar6 + uVar19);
      if (uVar19 < uVar3) {
        piVar17 = (int *)(pBVar8 + (uVar19 - uVar25));
      }
      pUVar9[uVar23] = UVar35;
      if ((uVar19 - uVar3 < 0xfffffffd) && (*piVar17 == *(int *)((long)plVar39 + 1))) {
        plVar40 = (long *)((long)plVar39 + 1);
        puVar21 = iEnd;
        if (uVar19 < uVar3) {
          puVar21 = mEnd;
        }
        sVar15 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar39 + 5),(BYTE *)(piVar17 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar21,iStart);
        uVar36 = (long)plVar40 - (long)src;
        plVar24 = (long *)seqStore->lit;
        plVar39 = (long *)((long)plVar24 + uVar36);
        do {
          *plVar24 = *src;
          plVar24 = plVar24 + 1;
          src = (void *)((long)src + 8);
        } while (plVar24 < plVar39);
        seqStore->lit = seqStore->lit + uVar36;
        if (0xffff < uVar36) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        unaff_R13 = (BYTE *)(sVar15 + 4);
        pBVar16 = (BYTE *)(sVar15 + 1);
        psVar12 = *ppsVar1;
        psVar12->litLength = (U16)uVar36;
        psVar12->offset = 1;
        UVar38 = local_fc;
joined_r0x004e40ec:
        local_fc = UVar38;
        if ((BYTE *)0xffff < pBVar16) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12->matchLength = (U16)pBVar16;
        *ppsVar1 = psVar12 + 1;
LAB_004e41b7:
        src = (void *)((long)plVar40 + (long)unaff_R13);
        plVar39 = (long *)src;
        if (src <= plVar2) {
          pUVar9[(uint)(*(int *)(pBVar6 + (uVar28 & 0xffffffff) + 2) * -0x61c8864f) >>
                 (bVar18 & 0x1f)] = UVar35 + 2;
          pUVar9[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar18 & 0x1f)] =
               ((int)src + -2) - iVar37;
          do {
            plVar39 = (long *)src;
            if (plVar2 < src) break;
            UVar35 = (int)src - iVar37;
            uVar22 = UVar35 - UVar33;
            pBVar16 = pBVar6;
            if (uVar22 < uVar3) {
              pBVar16 = pBVar8 + -uVar26;
            }
            if ((uVar22 - uVar3 < 0xfffffffd) && (*(int *)(pBVar16 + uVar22) == (int)*src)) {
              puVar21 = iEnd;
              if (uVar22 < uVar3) {
                puVar21 = mEnd;
              }
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar16 + uVar22) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar21,iStart);
              *(long *)seqStore->lit = *src;
              psVar12 = seqStore->sequences;
              psVar12->litLength = 0;
              psVar12->offset = 1;
              if (0xffff < sVar15 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar12->matchLength = (U16)(sVar15 + 1);
              seqStore->sequences = psVar12 + 1;
              pUVar9[(uint)((int)*src * -0x61c8864f) >> (bVar18 & 0x1f)] = UVar35;
              src = (void *)((long)src + sVar15 + 4);
              bVar14 = true;
              UVar35 = local_fc;
              local_fc = UVar33;
            }
            else {
              bVar14 = false;
              UVar35 = UVar33;
            }
            UVar33 = UVar35;
            plVar39 = (long *)src;
          } while (bVar14);
        }
      }
      else {
        plVar40 = plVar39;
        if (uVar3 < uVar22) {
          piVar17 = (int *)(pBVar6 + uVar22);
          if (*piVar17 == (int)*plVar39) {
            puVar21 = (ulong *)((long)plVar39 + 4);
            puVar29 = (ulong *)(piVar17 + 1);
            puVar27 = puVar21;
            if (puVar21 < (ulong *)((long)iEnd - 7U)) {
              uVar31 = *puVar21 ^ *puVar29;
              uVar36 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              pBVar16 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
              if (*puVar29 == *puVar21) {
                puVar27 = (ulong *)((long)plVar39 + 0xc);
                puVar29 = (ulong *)(piVar17 + 3);
                do {
                  if ((ulong *)((long)iEnd - 7U) <= puVar27) goto LAB_004e3fd0;
                  uVar36 = *puVar29;
                  uVar31 = *puVar27;
                  uVar32 = uVar31 ^ uVar36;
                  uVar13 = 0;
                  if (uVar32 != 0) {
                    for (; (uVar32 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                    }
                  }
                  pBVar16 = (BYTE *)((long)puVar27 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar21));
                  puVar27 = puVar27 + 1;
                  puVar29 = puVar29 + 1;
                } while (uVar36 == uVar31);
              }
            }
            else {
LAB_004e3fd0:
              if ((puVar27 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar29 == (int)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 4);
                puVar29 = (ulong *)((long)puVar29 + 4);
              }
              if ((puVar27 < (ulong *)((long)iEnd + -1)) && ((short)*puVar29 == (short)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 2);
                puVar29 = (ulong *)((long)puVar29 + 2);
              }
              if (puVar27 < iEnd) {
                puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar27));
              }
              pBVar16 = (BYTE *)((long)puVar27 - (long)puVar21);
            }
            unaff_R13 = pBVar16 + 4;
            if ((uVar3 < uVar22) && (src < plVar39)) {
              pBVar16 = pBVar6 + ((ulong)uVar22 - 1);
              do {
                plVar24 = (long *)((long)plVar40 + -1);
                if ((*(BYTE *)plVar24 != *pBVar16) ||
                   (unaff_R13 = unaff_R13 + 1, plVar40 = plVar24, pBVar16 <= iStart)) break;
                pBVar16 = pBVar16 + -1;
              } while (src < plVar24);
            }
            UVar38 = (int)plVar39 - (int)piVar17;
            uVar36 = (long)plVar40 - (long)src;
            plVar24 = (long *)seqStore->lit;
            plVar39 = (long *)((long)plVar24 + uVar36);
            do {
              *plVar24 = *src;
              plVar24 = plVar24 + 1;
              src = (void *)((long)src + 8);
            } while (plVar24 < plVar39);
            seqStore->lit = seqStore->lit + uVar36;
            if (0xffff < uVar36) {
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            pBVar16 = unaff_R13 + -3;
            psVar12 = *ppsVar1;
            psVar12->litLength = (U16)uVar36;
            psVar12->offset = UVar38 + 3;
            UVar33 = local_fc;
            goto joined_r0x004e40ec;
          }
          plVar39 = (long *)((long)plVar39 + ((long)plVar39 - (long)src >> 8) + uVar20);
        }
        else {
          uVar22 = pUVar10[(uint)((int)*plVar39 * -0x61c8864f) >> (0x20U - (char)uVar5 & 0x1f)];
          if ((uVar4 < uVar22) && (*(int *)(pBVar8 + uVar22) == (int)*plVar39)) {
            sVar15 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar39 + 4),(BYTE *)((long)(pBVar8 + uVar22) + 4),
                                (BYTE *)iEnd,(BYTE *)mEnd,iStart);
            unaff_R13 = (BYTE *)(sVar15 + 4);
            if ((uVar4 < uVar22) && (src < plVar39)) {
              pBVar16 = pBVar8 + ((ulong)uVar22 - 1);
              do {
                plVar24 = (long *)((long)plVar39 + -1);
                plVar40 = plVar39;
                if ((*(BYTE *)plVar24 != *pBVar16) ||
                   (unaff_R13 = unaff_R13 + 1, plVar40 = plVar24, pBVar16 <= pBVar34)) break;
                pBVar16 = pBVar16 + -1;
                plVar39 = plVar24;
              } while (src < plVar24);
            }
            UVar38 = UVar35 - (uVar25 + uVar22);
            uVar36 = (long)plVar40 - (long)src;
            plVar24 = (long *)seqStore->lit;
            plVar39 = (long *)((long)plVar24 + uVar36);
            plVar30 = (long *)src;
            do {
              *plVar24 = *plVar30;
              plVar24 = plVar24 + 1;
              plVar30 = plVar30 + 1;
            } while (plVar24 < plVar39);
            seqStore->lit = seqStore->lit + uVar36;
            if (0xffff < uVar36) {
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            psVar12 = seqStore->sequences;
            psVar12->litLength = (U16)uVar36;
            psVar12->offset = UVar38 + 3;
            if ((BYTE *)0xffff < unaff_R13 + -3) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar12->matchLength = (U16)(unaff_R13 + -3);
            seqStore->sequences = psVar12 + 1;
            bVar14 = true;
            UVar33 = local_fc;
            local_fc = UVar38;
          }
          else {
            plVar40 = (long *)((long)plVar39 + ((long)plVar39 - (long)src >> 8) + uVar20);
            bVar14 = false;
          }
          plVar39 = plVar40;
          if (bVar14) goto LAB_004e41b7;
        }
      }
    } while (plVar39 < plVar2);
  }
  *rep = local_fc;
  rep[1] = UVar33;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32 const mls = cParams->minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_dictMatchState);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_dictMatchState);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_dictMatchState);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_dictMatchState);
    }
}